

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osTime.cpp
# Opt level: O1

char * osTime::GetTimestamp(void)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  timespec ts;
  timespec local_18;
  
  clock_gettime(1,&local_18);
  uVar3 = local_18.tv_nsec / 1000 + local_18.tv_sec * 1000000;
  uVar5 = uVar3 / 1000000;
  uVar2 = uVar5 & 0xffffffff;
  iVar4 = (int)(uVar2 / 0x3c);
  uVar3 = uVar3 / 1000;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  snprintf(GetTimestamp::s,0x40,"%u:%02u:%02u.%03u",
           (ulong)(uint)((int)(uVar2 / 0xe10) + (int)(uVar2 / 0x15180) * -0x18),
           (ulong)(uint)(iVar4 + (int)(uVar2 / 0xe10) * -0x3c),
           (ulong)(uint)((int)uVar5 + iVar4 * -0x3c),
           (int)uVar3 + SUB164(auVar1 * ZEXT816(0x4189374bc6a7f0),8) * -1000);
  return GetTimestamp::s;
}

Assistant:

const char* osTime::GetTimestamp()
{
    static char s[64];
    uint32_t seconds;
    uint32_t sec;
    uint32_t min;
    uint32_t hour;
    uint64_t time;

    time = GetTime();

    seconds = (uint32_t)(time / 1000000);

    sec = seconds % 60;

    min = seconds / 60;
    min %= 60;

    hour = seconds / (60 * 60);
    hour %= 24;

#ifdef OSTIME_SHOW_PROCESSOR_TIMESTAMP
    struct _timeb timebuffer;
    _ftime(&timebuffer);
    char* timeline;
    timeline = ctime(&(timebuffer.time));
    timeline = strchr(timeline, ':') - 2;
    snprintf(s,
             sizeof(s),
             "%.8s.%hu(%u:%02u:%02u.%03u)",
             timeline,
             timebuffer.millitm,
             hour,
             min,
             sec,
             (uint32_t)((time / 1000) % 1000));
#else
    snprintf(s, sizeof(s), "%u:%02u:%02u.%03u", hour, min, sec, (uint32_t)((time / 1000) % 1000));
#endif
    return s;
}